

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Statement::visit<slang::ast::UnrollVisitor&>(Statement *this,UnrollVisitor *visitor)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  UnrollVisitor *local_18;
  UnrollVisitor *visitor_local;
  Statement *this_local;
  
  local_18 = visitor;
  visitor_local = (UnrollVisitor *)this;
  switch(this->kind) {
  case Invalid:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visitInvalid
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,this);
    break;
  case Empty:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::EmptyStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(EmptyStatement *)this)
    ;
    break;
  case List:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::StatementList>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(StatementList *)this);
    break;
  case Block:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::BlockStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(BlockStatement *)this)
    ;
    break;
  case ExpressionStatement:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ExpressionStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ExpressionStatement *)this);
    break;
  case VariableDeclaration:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::VariableDeclStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (VariableDeclStatement *)this);
    break;
  case Return:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ReturnStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(ReturnStatement *)this
              );
    break;
  case Continue:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ContinueStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ContinueStatement *)this);
    break;
  case Break:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::BreakStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(BreakStatement *)this)
    ;
    break;
  case Disable:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::DisableStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (DisableStatement *)this);
    break;
  case Conditional:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ConditionalStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ConditionalStatement *)this);
    break;
  case Case:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::CaseStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(CaseStatement *)this);
    break;
  case PatternCase:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::PatternCaseStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (PatternCaseStatement *)this);
    break;
  case ForLoop:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ForLoopStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ForLoopStatement *)this);
    break;
  case RepeatLoop:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::RepeatLoopStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (RepeatLoopStatement *)this);
    break;
  case ForeachLoop:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ForeachLoopStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ForeachLoopStatement *)this);
    break;
  case WhileLoop:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::WhileLoopStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (WhileLoopStatement *)this);
    break;
  case DoWhileLoop:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::DoWhileLoopStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (DoWhileLoopStatement *)this);
    break;
  case ForeverLoop:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ForeverLoopStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ForeverLoopStatement *)this);
    break;
  case Timed:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::TimedStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(TimedStatement *)this)
    ;
    break;
  case ImmediateAssertion:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::
    visit<slang::ast::ImmediateAssertionStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ImmediateAssertionStatement *)this);
    break;
  case ConcurrentAssertion:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::
    visit<slang::ast::ConcurrentAssertionStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ConcurrentAssertionStatement *)this);
    break;
  case DisableFork:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::DisableForkStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (DisableForkStatement *)this);
    break;
  case Wait:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::WaitStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,(WaitStatement *)this);
    break;
  case WaitFork:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::WaitForkStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (WaitForkStatement *)this);
    break;
  case WaitOrder:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::WaitOrderStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (WaitOrderStatement *)this);
    break;
  case EventTrigger:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::EventTriggerStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (EventTriggerStatement *)this);
    break;
  case ProceduralAssign:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::ProceduralAssignStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ProceduralAssignStatement *)this);
    break;
  case ProceduralDeassign:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::
    visit<slang::ast::ProceduralDeassignStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (ProceduralDeassignStatement *)this);
    break;
  case RandCase:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::RandCaseStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (RandCaseStatement *)this);
    break;
  case RandSequence:
    ASTVisitor<slang::ast::UnrollVisitor,_true,_false>::visit<slang::ast::RandSequenceStatement>
              ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false> *)visitor,
               (RandSequenceStatement *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x10e);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Statement::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case StatementKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case StatementKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Empty, EmptyStatement);
        CASE(List, StatementList);
        CASE(Block, BlockStatement);
        CASE(ExpressionStatement, ExpressionStatement);
        CASE(VariableDeclaration, VariableDeclStatement);
        CASE(Return, ReturnStatement);
        CASE(Break, BreakStatement);
        CASE(Continue, ContinueStatement);
        CASE(Disable, DisableStatement);
        CASE(Conditional, ConditionalStatement);
        CASE(Case, CaseStatement);
        CASE(PatternCase, PatternCaseStatement);
        CASE(ForLoop, ForLoopStatement);
        CASE(RepeatLoop, RepeatLoopStatement);
        CASE(ForeachLoop, ForeachLoopStatement);
        CASE(WhileLoop, WhileLoopStatement);
        CASE(DoWhileLoop, DoWhileLoopStatement);
        CASE(ForeverLoop, ForeverLoopStatement);
        CASE(Timed, TimedStatement);
        CASE(ImmediateAssertion, ImmediateAssertionStatement);
        CASE(ConcurrentAssertion, ConcurrentAssertionStatement);
        CASE(DisableFork, DisableForkStatement);
        CASE(Wait, WaitStatement);
        CASE(WaitFork, WaitForkStatement);
        CASE(WaitOrder, WaitOrderStatement);
        CASE(EventTrigger, EventTriggerStatement);
        CASE(ProceduralAssign, ProceduralAssignStatement);
        CASE(ProceduralDeassign, ProceduralDeassignStatement);
        CASE(RandCase, RandCaseStatement);
        CASE(RandSequence, RandSequenceStatement);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}